

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

QString * qt_setWindowTitle_helperHelper(QString *title,QWidget *widget)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  qsizetype qVar4;
  long lVar5;
  QStyle *pQVar6;
  undefined8 in_RDX;
  QString *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar7;
  int lastIndex;
  int count;
  int index;
  QString *cap;
  QLatin1StringView placeHolder;
  QWidget *in_stack_ffffffffffffff28;
  QString *str;
  QLatin1String *local_c0;
  int local_a8;
  int local_a4;
  QLatin1StringView local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  str = in_RDI;
  QString::QString(in_RDI,(QString *)in_stack_ffffffffffffff28);
  bVar1 = QString::isEmpty((QString *)0x371661);
  if (!bVar1) {
    local_18.m_data = &DAT_aaaaaaaaaaaaaaaa;
    local_18.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_18 = Qt::Literals::StringLiterals::operator____L1((char *)str,(size_t)in_RDI);
    local_a4 = QString::indexOf((QLatin1String *)str,local_18.m_size,
                                (CaseSensitivity)local_18.m_data);
    while (local_a4 != -1) {
      qVar4 = QLatin1String::size(&local_18);
      local_a4 = local_a4 + (int)qVar4;
      local_a8 = 1;
      while( true ) {
        lVar5 = QString::indexOf((QLatin1String *)str,local_18.m_size,
                                 (CaseSensitivity)local_18.m_data);
        if (lVar5 != local_a4) break;
        local_a8 = local_a8 + 1;
        qVar4 = QLatin1String::size(&local_18);
        local_a4 = local_a4 + (int)qVar4;
      }
      if (local_a8 % 2 != 0) {
        iVar2 = QString::lastIndexOf
                          ((QLatin1String *)str,local_18.m_size,(CaseSensitivity)local_18.m_data);
        bVar1 = QWidget::isWindowModified((QWidget *)0x371814);
        if (bVar1) {
          pQVar6 = QWidget::style(in_stack_ffffffffffffff28);
          iVar3 = (**(code **)(*(long *)pQVar6 + 0xf0))(pQVar6,0x30,0,in_RDX);
          if (iVar3 != 0) {
            in_stack_ffffffffffffff28 = (QWidget *)(long)iVar2;
            QWidget::tr((char *)str,(char *)in_RDI,iVar2 >> 0x1f);
            QString::replace((longlong)str,(longlong)in_stack_ffffffffffffff28,(QString *)0x3);
            QString::~QString((QString *)0x37188c);
            goto LAB_003718a4;
          }
        }
        QString::remove((longlong)str,(long)iVar2);
      }
LAB_003718a4:
      local_a4 = QString::indexOf((QLatin1String *)str,local_18.m_size,
                                  (CaseSensitivity)local_18.m_data);
    }
    QVar7 = Qt::Literals::StringLiterals::operator____L1((char *)str,(size_t)in_RDI);
    local_c0 = (QLatin1String *)QVar7.m_size;
    QString::replace((QLatin1String *)str,local_c0,(CaseSensitivity)QVar7.m_data);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString qt_setWindowTitle_helperHelper(const QString &title, const QWidget *widget)
{
    Q_ASSERT(widget);

    QString cap = title;
    if (cap.isEmpty())
        return cap;

    const auto placeHolder = "[*]"_L1;
    int index = cap.indexOf(placeHolder);

    // here the magic begins
    while (index != -1) {
        index += placeHolder.size();
        int count = 1;
        while (cap.indexOf(placeHolder, index) == index) {
            ++count;
            index += placeHolder.size();
        }

        if (count%2) { // odd number of [*] -> replace last one
            int lastIndex = cap.lastIndexOf(placeHolder, index - 1);
            if (widget->isWindowModified()
             && widget->style()->styleHint(QStyle::SH_TitleBar_ModifyNotification, nullptr, widget))
                cap.replace(lastIndex, 3, QWidget::tr("*"));
            else
                cap.remove(lastIndex, 3);
        }

        index = cap.indexOf(placeHolder, index);
    }

    cap.replace("[*][*]"_L1, placeHolder);

    return cap;
}